

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindow * CreateNewWindow(char *name,ImVec2 size,ImGuiWindowFlags flags)

{
  int iVar1;
  ImGuiWindow *this;
  ImVec2 IVar2;
  bool local_89;
  ImVec2 local_68;
  ImVec2 local_60;
  ImGuiWindowSettings *local_58;
  ImGuiWindowSettings *settings;
  ImGuiWindow *local_30;
  ImGuiWindow *window;
  ImGuiContext *g;
  char *pcStack_18;
  ImGuiWindowFlags flags_local;
  char *name_local;
  ImVec2 size_local;
  
  window = (ImGuiWindow *)GImGui;
  g._4_4_ = flags;
  pcStack_18 = name;
  name_local = (char *)size;
  ImGui::MemAlloc(0x3c0);
  this = (ImGuiWindow *)operator_new(0x3c0);
  ImGuiWindow::ImGuiWindow(this,(ImGuiContext *)window,pcStack_18);
  this->Flags = g._4_4_;
  local_30 = this;
  ImGuiStorage::SetVoidPtr((ImGuiStorage *)&window[6].NavLastChildNavWindow,this->ID,this);
  ImVec2::ImVec2((ImVec2 *)((long)&settings + 4),60.0,60.0);
  local_30->Pos = stack0xffffffffffffffb4;
  if (((g._4_4_ & 0x100) == 0) &&
     (local_58 = ImGui::FindWindowSettings(local_30->ID), local_58 != (ImGuiWindowSettings *)0x0)) {
    iVar1 = ImChunkStream<ImGuiWindowSettings>::offset_from_ptr
                      ((ImChunkStream<ImGuiWindowSettings> *)&window[0xc].OuterRectClipped.Max,
                       local_58);
    local_30->SettingsOffset = iVar1;
    SetWindowConditionAllowFlags(local_30,4,false);
    ImVec2::ImVec2(&local_60,(float)(int)(local_58->Pos).x,(float)(int)(local_58->Pos).y);
    local_30->Pos = local_60;
    local_30->Collapsed = (bool)(local_58->Collapsed & 1);
    if ((0 < (local_58->Size).x) && (0 < (local_58->Size).y)) {
      ImVec2::ImVec2(&local_68,(float)(int)(local_58->Size).x,(float)(int)(local_58->Size).y);
      name_local = (char *)local_68;
    }
  }
  IVar2 = ImFloor((ImVec2 *)&name_local);
  local_30->SizeFull = IVar2;
  local_30->Size = local_30->SizeFull;
  (local_30->DC).CursorMaxPos = local_30->Pos;
  (local_30->DC).CursorStartPos = (local_30->DC).CursorMaxPos;
  if ((g._4_4_ & 0x40) == 0) {
    if ((local_30->Size).x <= 0.0) {
      local_30->AutoFitFramesX = '\x02';
    }
    if ((local_30->Size).y <= 0.0) {
      local_30->AutoFitFramesY = '\x02';
    }
    local_89 = true;
    if (local_30->AutoFitFramesX < '\x01') {
      local_89 = '\0' < local_30->AutoFitFramesY;
    }
    local_30->AutoFitOnlyGrows = local_89;
  }
  else {
    local_30->AutoFitFramesY = '\x02';
    local_30->AutoFitFramesX = '\x02';
    local_30->AutoFitOnlyGrows = false;
  }
  ImVector<ImGuiWindow_*>::push_back
            ((ImVector<ImGuiWindow_*> *)&window[6].DrawListInst._Splitter._Channels,&local_30);
  if ((g._4_4_ & 0x2000) == 0) {
    ImVector<ImGuiWindow_*>::push_back
              ((ImVector<ImGuiWindow_*> *)&window[6].DrawListInst._Path.Data,&local_30);
  }
  else {
    ImVector<ImGuiWindow_*>::push_front
              ((ImVector<ImGuiWindow_*> *)&window[6].DrawListInst._Path.Data,&local_30);
  }
  return local_30;
}

Assistant:

static ImGuiWindow* CreateNewWindow(const char* name, ImVec2 size, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    //IMGUI_DEBUG_LOG("CreateNewWindow '%s', flags = 0x%08X\n", name, flags);

    // Create window the first time
    ImGuiWindow* window = IM_NEW(ImGuiWindow)(&g, name);
    window->Flags = flags;
    g.WindowsById.SetVoidPtr(window->ID, window);

    // Default/arbitrary window position. Use SetNextWindowPos() with the appropriate condition flag to change the initial position of a window.
    window->Pos = ImVec2(60, 60);

    // User can disable loading and saving of settings. Tooltip and child windows also don't store settings.
    if (!(flags & ImGuiWindowFlags_NoSavedSettings))
        if (ImGuiWindowSettings* settings = ImGui::FindWindowSettings(window->ID))
        {
            // Retrieve settings from .ini file
            window->SettingsOffset = g.SettingsWindows.offset_from_ptr(settings);
            SetWindowConditionAllowFlags(window, ImGuiCond_FirstUseEver, false);
            window->Pos = ImVec2(settings->Pos.x, settings->Pos.y);
            window->Collapsed = settings->Collapsed;
            if (settings->Size.x > 0 && settings->Size.y > 0)
                size = ImVec2(settings->Size.x, settings->Size.y);
        }
    window->Size = window->SizeFull = ImFloor(size);
    window->DC.CursorStartPos = window->DC.CursorMaxPos = window->Pos; // So first call to CalcContentSize() doesn't return crazy values

    if ((flags & ImGuiWindowFlags_AlwaysAutoResize) != 0)
    {
        window->AutoFitFramesX = window->AutoFitFramesY = 2;
        window->AutoFitOnlyGrows = false;
    }
    else
    {
        if (window->Size.x <= 0.0f)
            window->AutoFitFramesX = 2;
        if (window->Size.y <= 0.0f)
            window->AutoFitFramesY = 2;
        window->AutoFitOnlyGrows = (window->AutoFitFramesX > 0) || (window->AutoFitFramesY > 0);
    }

    g.WindowsFocusOrder.push_back(window);
    if (flags & ImGuiWindowFlags_NoBringToFrontOnFocus)
        g.Windows.push_front(window); // Quite slow but rare and only once
    else
        g.Windows.push_back(window);
    return window;
}